

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O0

void __thiscall Type::GenBufferConfiguration(Type *this,Output *out_cc,Env *env)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  Env *in_RSI;
  Type *in_RDI;
  string frame_buffer_arg;
  ID *in_stack_fffffffffffffec8;
  Env *in_stack_fffffffffffffed0;
  Env *pEVar7;
  Type *in_stack_fffffffffffffed8;
  ID *in_stack_fffffffffffffef0;
  Env *in_stack_fffffffffffffef8;
  string local_68 [48];
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8);
  iVar2 = (*(in_RDI->super_DataDepElement)._vptr_DataDepElement[0x16])();
  if (iVar2 != 1) {
    if (iVar2 == 2) {
      bVar1 = NeedsBufferingStateVar(in_stack_fffffffffffffed8);
      if (bVar1) {
        pcVar5 = Env::RValue(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        Output::println((Output *)in_RSI,"if ( %s == 0 )",pcVar5);
        Output::inc_indent((Output *)in_RSI);
        Output::println((Output *)in_RSI,"{");
        if (in_RDI->attr_length_expr_ == (Expr *)0x0) {
          if ((in_RDI->attr_restofflow_ & 1U) != 0) {
            std::__cxx11::string::operator=((string *)&stack0xffffffffffffffc8,"-1");
          }
        }
        else {
          uVar3 = InitialBufferLength(in_stack_fffffffffffffed8);
          strfmt_abi_cxx11_((char *)local_68,"%d",(ulong)uVar3);
          std::__cxx11::string::operator=((string *)&stack0xffffffffffffffc8,local_68);
          std::__cxx11::string::~string(local_68);
        }
        pcVar5 = Env::LValue(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        uVar4 = std::__cxx11::string::c_str();
        bVar1 = attr_chunked(in_RDI);
        pcVar6 = "false";
        if (bVar1) {
          pcVar6 = "true";
        }
        Output::println((Output *)in_RSI,"%s->NewFrame(%s, %s);",pcVar5,uVar4,pcVar6);
        pcVar5 = Env::LValue(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        Output::println((Output *)in_RSI,"%s = 1;",pcVar5);
        Output::println((Output *)in_RSI,"}");
        Output::dec_indent((Output *)in_RSI);
      }
    }
    else if (iVar2 == 3) {
      pcVar5 = Env::RValue(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      Output::println((Output *)in_RSI,"if ( %s == 0 )",pcVar5);
      Output::inc_indent((Output *)in_RSI);
      Output::println((Output *)in_RSI,"{");
      bVar1 = BufferableWithLineBreaker(in_RDI);
      if (bVar1) {
        pcVar5 = Env::LValue(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        LineBreaker(in_RDI);
        pcVar6 = Expr::orig((Expr *)0x14e462);
        Output::println((Output *)in_RSI,"%s->SetLineBreaker((unsigned char*)%s);",pcVar5,pcVar6);
      }
      else {
        pEVar7 = in_RSI;
        pcVar5 = Env::LValue(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        Output::println((Output *)pEVar7,"%s->UnsetLineBreaker();",pcVar5);
      }
      pcVar5 = Env::LValue(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      Output::println((Output *)in_RSI,"%s->NewLine();",pcVar5);
      pEVar7 = in_RSI;
      pcVar5 = Env::LValue(in_RSI,in_stack_fffffffffffffec8);
      Output::println((Output *)pEVar7,"%s = 1;",pcVar5);
      Output::println((Output *)in_RSI,"}");
      Output::dec_indent((Output *)in_RSI);
    }
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void Type::GenBufferConfiguration(Output* out_cc, Env* env)
	{
	ASSERT(buffer_input());

	string frame_buffer_arg;

	switch ( buffer_mode() )
		{
		case BUFFER_NOTHING:
			break;

		case BUFFER_BY_LENGTH:
			if ( ! NeedsBufferingStateVar() )
				break;

			ASSERT(env->GetDataType(buffering_state_id));
			out_cc->println("if ( %s == 0 )", env->RValue(buffering_state_id));
			out_cc->inc_indent();
			out_cc->println("{");

			if ( attr_length_expr_ )
				{
				// frame_buffer_arg = attr_length_expr_->EvalExpr(out_cc, env);
				frame_buffer_arg = strfmt("%d", InitialBufferLength());
				}
			else if ( attr_restofflow_ )
				{
				ASSERT(attr_chunked());
				frame_buffer_arg = "-1";
				}
			else
				{
				ASSERT(0);
				}

			out_cc->println("%s->NewFrame(%s, %s);", env->LValue(flow_buffer_id),
			                frame_buffer_arg.c_str(), attr_chunked() ? "true" : "false");

			out_cc->println("%s = 1;", env->LValue(buffering_state_id));
			out_cc->println("}");
			out_cc->dec_indent();
			break;

		case BUFFER_BY_LINE:
			ASSERT(env->GetDataType(buffering_state_id));
			out_cc->println("if ( %s == 0 )", env->RValue(buffering_state_id));
			out_cc->inc_indent();
			out_cc->println("{");

			if ( BufferableWithLineBreaker() )
				out_cc->println("%s->SetLineBreaker((unsigned char*)%s);",
				                env->LValue(flow_buffer_id), LineBreaker()->orig());
			else
				out_cc->println("%s->UnsetLineBreaker();", env->LValue(flow_buffer_id));

			out_cc->println("%s->NewLine();", env->LValue(flow_buffer_id));

			out_cc->println("%s = 1;", env->LValue(buffering_state_id));
			out_cc->println("}");
			out_cc->dec_indent();
			break;

		default:
			ASSERT(0);
			break;
		}
	}